

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O0

lws * lws_create_new_server_wsi(lws_vhost *vhost,int fixed_tsi)

{
  bool local_2d;
  int local_2c;
  int n;
  lws *new_wsi;
  int fixed_tsi_local;
  lws_vhost *vhost_local;
  
  local_2c = fixed_tsi;
  if (fixed_tsi < 0) {
    local_2c = lws_get_idlest_tsi(vhost->context);
  }
  if (local_2c < 0) {
    _lws_log(1,"no space for new conn\n");
    vhost_local = (lws_vhost *)0x0;
  }
  else {
    vhost_local = (lws_vhost *)lws_zalloc(0x300,"new server wsi");
    if ((lws *)vhost_local == (lws *)0x0) {
      _lws_log(1,"Out of memory for new connection\n");
      vhost_local = (lws_vhost *)0x0;
    }
    else {
      ((lws *)vhost_local)->wsistate = ((lws *)vhost_local)->wsistate | 0x20000000;
      ((lws *)vhost_local)->tsi = (char)local_2c;
      _lws_log(0x10,"new wsi %p joining vhost %s, tsi %d\n",vhost_local,vhost->name,
               (ulong)(uint)(int)((lws *)vhost_local)->tsi);
      lws_vhost_bind_wsi(vhost,(lws *)vhost_local);
      ((lws *)vhost_local)->context = vhost->context;
      ((lws *)vhost_local)->pending_timeout = '\0';
      *(ulong *)&((lws *)vhost_local)->field_0x2dc =
           *(ulong *)&((lws *)vhost_local)->field_0x2dc & 0xffffffffffff9fff | 0x2000;
      ((lws *)vhost_local)->retry_policy = vhost->retry_policy;
      lwsi_set_state((lws *)vhost_local,0x200);
      *(ulong *)&((lws *)vhost_local)->field_0x2dc =
           *(ulong *)&((lws *)vhost_local)->field_0x2dc & 0xfffffffffffffffe;
      local_2d = false;
      if (vhost != (lws_vhost *)0x0) {
        local_2d = (vhost->tls).use_ssl != 0;
      }
      (((lws *)vhost_local)->tls).use_ssl = (uint)local_2d;
      ((lws *)vhost_local)->protocol = vhost->protocols;
      ((lws *)vhost_local)->user_space = (void *)0x0;
      (((lws *)vhost_local)->desc).sockfd = -1;
      ((lws *)vhost_local)->position_in_fds_table = -1;
      vhost->context->count_wsi_allocated = vhost->context->count_wsi_allocated + 1;
      (*vhost->protocols->callback)
                ((lws *)vhost_local,LWS_CALLBACK_WSI_CREATE,(void *)0x0,(void *)0x0,0);
    }
  }
  return (lws *)vhost_local;
}

Assistant:

struct lws *
lws_create_new_server_wsi(struct lws_vhost *vhost, int fixed_tsi)
{
	struct lws *new_wsi;
	int n = fixed_tsi;

	if (n < 0)
		n = lws_get_idlest_tsi(vhost->context);

	if (n < 0) {
		lwsl_err("no space for new conn\n");
		return NULL;
	}

	new_wsi = lws_zalloc(sizeof(struct lws), "new server wsi");
	if (new_wsi == NULL) {
		lwsl_err("Out of memory for new connection\n");
		return NULL;
	}

	new_wsi->wsistate |= LWSIFR_SERVER;
	new_wsi->tsi = n;
	lwsl_debug("new wsi %p joining vhost %s, tsi %d\n", new_wsi,
		   vhost->name, new_wsi->tsi);

	lws_vhost_bind_wsi(vhost, new_wsi);
	new_wsi->context = vhost->context;
	new_wsi->pending_timeout = NO_PENDING_TIMEOUT;
	new_wsi->rxflow_change_to = LWS_RXFLOW_ALLOW;
	new_wsi->retry_policy = vhost->retry_policy;

#if defined(LWS_WITH_DETAILED_LATENCY)
	if (vhost->context->detailed_latency_cb)
		new_wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif

	/* initialize the instance struct */

	lwsi_set_state(new_wsi, LRS_UNCONNECTED);
	new_wsi->hdr_parsing_completed = 0;

#ifdef LWS_WITH_TLS
	new_wsi->tls.use_ssl = LWS_SSL_ENABLED(vhost);
#endif

	/*
	 * these can only be set once the protocol is known
	 * we set an un-established connection's protocol pointer
	 * to the start of the supported list, so it can look
	 * for matching ones during the handshake
	 */
	new_wsi->protocol = vhost->protocols;
	new_wsi->user_space = NULL;
	new_wsi->desc.sockfd = LWS_SOCK_INVALID;
	new_wsi->position_in_fds_table = LWS_NO_FDS_POS;

	vhost->context->count_wsi_allocated++;

	/*
	 * outermost create notification for wsi
	 * no user_space because no protocol selection
	 */
	vhost->protocols[0].callback(new_wsi, LWS_CALLBACK_WSI_CREATE, NULL,
				     NULL, 0);

	return new_wsi;
}